

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_write_record(mbedtls_ssl_context *ssl)

{
  size_t sVar1;
  uint *puVar2;
  byte bVar3;
  ushort uVar4;
  uint uVar5;
  mbedtls_ssl_flight_item *pmVar6;
  mbedtls_cipher_info_t *pmVar7;
  mbedtls_ssl_transform *pmVar8;
  ulong uVar9;
  byte *pbVar10;
  uchar uVar11;
  char cVar12;
  int iVar13;
  undefined8 *__ptr;
  void *__dest;
  mbedtls_ssl_flight_item *pmVar14;
  int iVar15;
  size_t sVar16;
  long lVar17;
  uchar uVar18;
  char cVar19;
  ulong uVar20;
  mbedtls_cipher_mode_t mVar21;
  uint uVar22;
  long lVar23;
  char *pcVar24;
  size_t sVar25;
  size_t sVar26;
  mbedtls_ssl_handshake_params *unaff_R12;
  undefined8 uVar27;
  size_t sVar29;
  uchar *puVar30;
  bool bVar31;
  size_t olen_1;
  size_t olen;
  undefined8 in_stack_ffffffffffffff88;
  size_t *psVar32;
  undefined4 uVar33;
  undefined8 in_stack_ffffffffffffff90;
  uchar *input;
  long lVar34;
  undefined4 uVar35;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 uVar36;
  size_t local_50;
  undefined4 local_44;
  size_t local_40;
  undefined2 local_38;
  uchar local_36;
  ushort local_35;
  undefined7 uVar28;
  
  uVar36 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  uVar35 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  uVar33 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  sVar29 = ssl->out_msglen;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0xa8d,"=> write record");
  if (((((ssl->conf->field_0x174 & 2) == 0) ||
       (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) ||
      (ssl->handshake->retransmit_state != '\x01')) && (ssl->out_msgtype == 0x16)) {
    uVar11 = *ssl->out_msg;
    if ((uVar11 != '\0') && (ssl->handshake == (mbedtls_ssl_handshake_params *)0x0)) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0xa9f,"should never happen");
      return -0x6c00;
    }
    sVar1 = sVar29 - 4;
    ssl->out_msg[1] = (uchar)(sVar1 >> 0x10);
    ssl->out_msg[2] = (uchar)(sVar1 >> 8);
    ssl->out_msg[3] = (uchar)sVar1;
    if ((ssl->conf->field_0x174 & 2) != 0) {
      memmove(ssl->out_msg + 0xc,ssl->out_msg + 4,sVar1);
      ssl->out_msglen = ssl->out_msglen + 8;
      if (uVar11 == '\0') {
        ssl->out_msg[4] = '\0';
        ssl->out_msg[5] = '\0';
      }
      else {
        ssl->out_msg[4] = *(uchar *)((long)&ssl->handshake->out_msg_seq + 1);
        ssl->out_msg[5] = (uchar)ssl->handshake->out_msg_seq;
        puVar2 = &ssl->handshake->out_msg_seq;
        *puVar2 = *puVar2 + 1;
      }
      sVar29 = sVar29 + 8;
      puVar30 = ssl->out_msg;
      puVar30[8] = '\0';
      puVar30[6] = '\0';
      puVar30[7] = '\0';
      puVar30 = ssl->out_msg;
      puVar30[0xb] = puVar30[3];
      *(undefined2 *)(puVar30 + 9) = *(undefined2 *)(puVar30 + 1);
    }
    if (uVar11 != '\0') {
      (*ssl->handshake->update_checksum)(ssl,ssl->out_msg,sVar29);
    }
  }
  if ((((ssl->conf->field_0x174 & 2) != 0) &&
      (unaff_R12 = ssl->handshake, unaff_R12 != (mbedtls_ssl_handshake_params *)0x0)) &&
     ((unaff_R12->retransmit_state != '\x01' && (uVar5 = ssl->out_msgtype, (uVar5 | 2) == 0x16)))) {
    __ptr = (undefined8 *)calloc(1,0x20);
    if (__ptr == (undefined8 *)0x0) {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x9b0,"alloc %d bytes failed",0x20);
    }
    else {
      sVar1 = ssl->out_msglen;
      __dest = calloc(1,sVar1);
      *__ptr = __dest;
      if (__dest != (void *)0x0) {
        memcpy(__dest,ssl->out_msg,sVar1);
        __ptr[1] = sVar1;
        *(char *)(__ptr + 2) = (char)uVar5;
        pmVar6 = unaff_R12->flight;
        if (unaff_R12->flight == (mbedtls_ssl_flight_item *)0x0) {
          unaff_R12 = (mbedtls_ssl_handshake_params *)&unaff_R12->flight;
        }
        else {
          do {
            pmVar14 = pmVar6;
            pmVar6 = pmVar14->next;
          } while (pmVar6 != (mbedtls_ssl_flight_item *)0x0);
          unaff_R12 = (mbedtls_ssl_handshake_params *)&pmVar14->next;
        }
        *(undefined8 **)unaff_R12 = __ptr;
        goto LAB_00112648;
      }
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x9b6,"alloc %d bytes failed",sVar1);
      free(__ptr);
    }
    pcVar24 = "ssl_flight_append";
    iVar13 = -0x7f00;
    iVar15 = 0xad7;
    goto LAB_0011273d;
  }
LAB_00112648:
  *ssl->out_hdr = (uchar)ssl->out_msgtype;
  uVar5 = ssl->minor_ver;
  uVar11 = (uchar)ssl->major_ver;
  uVar22 = 1;
  if (uVar5 != 2) {
    uVar22 = uVar5;
  }
  bVar31 = (ssl->conf->field_0x174 & 2) == 0;
  uVar18 = '\x01' - uVar11;
  if (bVar31) {
    uVar18 = uVar11;
  }
  puVar30 = ssl->out_hdr;
  uVar22 = (uint)(byte)-(char)uVar22;
  if (bVar31) {
    uVar22 = uVar5;
  }
  puVar30[1] = uVar18;
  puVar30[2] = (uchar)uVar22;
  *ssl->out_len = (uchar)(sVar29 >> 8);
  ssl->out_len[1] = (uchar)sVar29;
  if (ssl->transform_out == (mbedtls_ssl_transform *)0x0) goto LAB_00112ea7;
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,0x4ea,"=> encrypt buf");
  if ((ssl->session_out == (mbedtls_ssl_session *)0x0) ||
     (ssl->transform_out == (mbedtls_ssl_transform *)0x0)) {
    iVar13 = 0x4ee;
LAB_00112713:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar13,"should never happen");
    iVar13 = -0x6c00;
  }
  else {
    pmVar7 = (ssl->transform_out->cipher_ctx_enc).cipher_info;
    if (pmVar7 == (mbedtls_cipher_info_t *)0x0) {
      mVar21 = MBEDTLS_MODE_NONE;
    }
    else {
      mVar21 = pmVar7->mode;
    }
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,0x4f5,"before encrypt: output payload",ssl->out_msg,ssl->out_msglen);
    if (mVar21 == MBEDTLS_MODE_STREAM) {
LAB_00112784:
      if (ssl->minor_ver < 1) {
        iVar13 = 0x51c;
        goto LAB_00112713;
      }
      mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_ctr,8);
      mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_hdr,3);
      mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_len,2);
      mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_msg,ssl->out_msglen);
      mbedtls_md_hmac_finish(&ssl->transform_out->md_ctx_enc,ssl->out_msg + ssl->out_msglen);
      mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
      sVar29 = ssl->transform_out->maclen;
      mbedtls_debug_print_buf
                (ssl,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x522,"computed mac",ssl->out_msg + ssl->out_msglen,sVar29);
      sVar25 = ssl->out_msglen + ssl->transform_out->maclen;
      ssl->out_msglen = sVar25;
      if (mVar21 != MBEDTLS_MODE_STREAM) {
        uVar27 = 0;
        goto LAB_00112945;
      }
      psVar32 = &local_40;
      local_40 = 0;
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x534,"before encrypt: msglen = %d, including %d bytes of padding",sVar25,
                 sVar29 & 0xffffffff00000000);
      pmVar8 = ssl->transform_out;
      iVar13 = mbedtls_cipher_crypt
                         (&pmVar8->cipher_ctx_enc,pmVar8->iv_enc,pmVar8->ivlen,ssl->out_msg,
                          ssl->out_msglen,ssl->out_msg,psVar32);
      uVar33 = (undefined4)((ulong)psVar32 >> 0x20);
      if (iVar13 == 0) {
        if (ssl->out_msglen != local_40) {
          iVar13 = 0x542;
          goto LAB_00112713;
        }
LAB_00112e6b:
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0x618,"<= encrypt buf");
        sVar29 = ssl->out_msglen;
        *ssl->out_len = (uchar)(sVar29 >> 8);
        ssl->out_len[1] = (uchar)sVar29;
LAB_00112ea7:
        pbVar10 = ssl->out_hdr;
        ssl->out_left = ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5;
        mbedtls_debug_print_msg
                  (ssl,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb16,"output record: msgtype = %d, version = [%d:%d], msglen = %d",
                   (ulong)*pbVar10,CONCAT44(uVar33,(uint)pbVar10[1]),
                   CONCAT44(uVar35,(uint)pbVar10[2]),
                   CONCAT44(uVar36,(uint)(ushort)(*(ushort *)ssl->out_len << 8 |
                                                 *(ushort *)ssl->out_len >> 8)));
        mbedtls_debug_print_buf
                  (ssl,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb19,"output record sent to network",ssl->out_hdr,
                   ssl->out_msglen + (ulong)(*(uint *)&ssl->conf->field_0x174 & 2) * 4 + 5);
        iVar13 = mbedtls_ssl_flush_output(ssl);
        if (iVar13 != 0) {
          mbedtls_debug_print_ret
                    (ssl,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                     ,0xb1e,"mbedtls_ssl_flush_output",iVar13);
          return iVar13;
        }
        mbedtls_debug_print_msg
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                   ,0xb22,"<= write record");
        return 0;
      }
      pcVar24 = "mbedtls_cipher_crypt";
      iVar15 = 0x53c;
    }
    else {
      uVar28 = (undefined7)((ulong)unaff_R12 >> 8);
      uVar27 = CONCAT71(uVar28,1);
      if (mVar21 == MBEDTLS_MODE_CBC) {
        uVar27 = CONCAT71(uVar28,1);
        if (ssl->session_out->encrypt_then_mac == 0) goto LAB_00112784;
      }
      else {
LAB_00112945:
        if (mVar21 != MBEDTLS_MODE_CBC) {
          if ((mVar21 == MBEDTLS_MODE_CCM) || (mVar21 == MBEDTLS_MODE_GCM)) {
            bVar3 = ssl->transform_out->ciphersuite_info->flags;
            local_40 = *(size_t *)ssl->out_ctr;
            uVar5 = ssl->minor_ver;
            cVar12 = (char)ssl->major_ver;
            uVar22 = 1;
            if (uVar5 != 2) {
              uVar22 = uVar5;
            }
            bVar31 = (ssl->conf->field_0x174 & 2) == 0;
            cVar19 = '\x01' - cVar12;
            if (bVar31) {
              cVar19 = cVar12;
            }
            uVar22 = (uint)(byte)-(char)uVar22;
            if (bVar31) {
              uVar22 = uVar5;
            }
            local_38 = CONCAT11(cVar19,(char)ssl->out_msgtype);
            local_36 = (uchar)uVar22;
            uVar4 = (ushort)ssl->out_msglen;
            local_35 = uVar4 << 8 | uVar4 >> 8;
            mbedtls_debug_print_buf
                      (ssl,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x55b,"additional data used for AEAD",(uchar *)&local_40,0xd);
            pmVar8 = ssl->transform_out;
            if (pmVar8->ivlen - pmVar8->fixed_ivlen == 8) {
              local_44 = (undefined4)uVar27;
              sVar29 = (ulong)((bVar3 & 2) == 0) * 8 + 8;
              *(undefined8 *)(pmVar8->iv_enc + pmVar8->fixed_ivlen) = *(undefined8 *)ssl->out_ctr;
              *(undefined8 *)ssl->out_iv = *(undefined8 *)ssl->out_ctr;
              sVar16 = ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen;
              mbedtls_debug_print_buf
                        (ssl,4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0x56c,"IV used",ssl->out_iv,sVar16);
              input = ssl->out_msg;
              sVar25 = ssl->out_msglen;
              sVar26 = (ssl->transform_out->ivlen - ssl->transform_out->fixed_ivlen) + sVar25;
              ssl->out_msglen = sVar26;
              mbedtls_debug_print_msg
                        (ssl,3,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                         ,0x578,"before encrypt: msglen = %d, including %d bytes of padding",sVar26,
                         sVar16 & 0xffffffff00000000);
              pmVar8 = ssl->transform_out;
              puVar30 = input + sVar25;
              psVar32 = &local_50;
              iVar13 = mbedtls_cipher_auth_encrypt
                                 (&pmVar8->cipher_ctx_enc,pmVar8->iv_enc,pmVar8->ivlen,
                                  (uchar *)&local_40,0xd,input,sVar25,input,psVar32,puVar30,sVar29);
              uVar35 = (undefined4)((ulong)input >> 0x20);
              uVar36 = (undefined4)((ulong)psVar32 >> 0x20);
              if (iVar13 != 0) {
                pcVar24 = "mbedtls_cipher_auth_encrypt";
                iVar15 = 0x585;
                goto LAB_00112c89;
              }
              if (local_50 == sVar25) {
                ssl->out_msglen = ssl->out_msglen + sVar29;
                mbedtls_debug_print_buf
                          (ssl,4,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                           ,0x592,"after encrypt: tag",puVar30,sVar29);
                uVar33 = (undefined4)(sVar29 >> 0x20);
                if ((char)local_44 != '\0') goto LAB_00112e6b;
                iVar13 = 0x614;
              }
              else {
                iVar13 = 0x58b;
              }
            }
            else {
              iVar13 = 0x563;
            }
          }
          else {
            iVar13 = 0x60d;
          }
          goto LAB_00112713;
        }
      }
      local_50 = 0;
      uVar9 = ssl->transform_out->ivlen;
      lVar23 = 0;
      uVar20 = (ssl->out_msglen + 1) % uVar9;
      lVar17 = uVar9 - uVar20;
      if (uVar20 == 0) {
        lVar17 = 0;
      }
      lVar34 = lVar17 + 1;
      do {
        ssl->out_msg[lVar23 + ssl->out_msglen] = (uchar)lVar17;
        lVar23 = lVar23 + 1;
      } while (lVar17 + 1 + (ulong)(lVar34 == 0) != lVar23);
      sVar29 = ssl->out_msglen + lVar34;
      ssl->out_msglen = sVar29;
      pmVar8 = ssl->transform_out;
      if (1 < ssl->minor_ver) {
        iVar13 = (*ssl->conf->f_rng)(ssl->conf->p_rng,pmVar8->iv_enc,pmVar8->ivlen);
        if (iVar13 == 0) {
          memcpy(ssl->out_iv,ssl->transform_out->iv_enc,ssl->transform_out->ivlen);
          puVar30 = ssl->out_msg;
          sVar25 = ssl->out_msglen;
          sVar16 = ssl->transform_out->ivlen;
          sVar29 = sVar16 + sVar25;
          ssl->out_msglen = sVar29;
          goto LAB_00112c0f;
        }
        goto LAB_0011271f;
      }
      puVar30 = ssl->out_msg;
      sVar16 = pmVar8->ivlen;
      sVar25 = sVar29;
LAB_00112c0f:
      mbedtls_debug_print_msg
                (ssl,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                 ,0x5c9,
                 "before encrypt: msglen = %d, including %d bytes of IV and %d bytes of padding",
                 sVar29,sVar16,lVar34);
      uVar35 = (undefined4)((ulong)lVar34 >> 0x20);
      pmVar8 = ssl->transform_out;
      psVar32 = &local_50;
      iVar13 = mbedtls_cipher_crypt
                         (&pmVar8->cipher_ctx_enc,pmVar8->iv_enc,pmVar8->ivlen,puVar30,sVar25,
                          puVar30,psVar32);
      uVar33 = (undefined4)((ulong)psVar32 >> 0x20);
      if (iVar13 == 0) {
        if (sVar25 == local_50) {
          if (ssl->minor_ver < 2) {
            pmVar8 = ssl->transform_out;
            memcpy(pmVar8->iv_enc,(pmVar8->cipher_ctx_enc).iv,pmVar8->ivlen);
          }
          if ((char)uVar27 != '\0') {
            mbedtls_debug_print_msg
                      (ssl,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x5f4,"using encrypt then mac");
            local_40 = *(size_t *)ssl->out_ctr;
            local_36 = ssl->out_hdr[2];
            local_38 = *(undefined2 *)ssl->out_hdr;
            uVar4 = (ushort)ssl->out_msglen;
            local_35 = uVar4 << 8 | uVar4 >> 8;
            uVar33 = 0;
            mbedtls_debug_print_buf
                      (ssl,4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
                       ,0x5fb,"MAC\'d meta-data",(uchar *)&local_40,0xd);
            mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,(uchar *)&local_40,0xd);
            mbedtls_md_hmac_update(&ssl->transform_out->md_ctx_enc,ssl->out_iv,ssl->out_msglen);
            mbedtls_md_hmac_finish(&ssl->transform_out->md_ctx_enc,ssl->out_iv + ssl->out_msglen);
            mbedtls_md_hmac_reset(&ssl->transform_out->md_ctx_enc);
            ssl->out_msglen = ssl->out_msglen + ssl->transform_out->maclen;
          }
          goto LAB_00112e6b;
        }
        iVar13 = 0x5d7;
        goto LAB_00112713;
      }
      pcVar24 = "mbedtls_cipher_crypt";
      iVar15 = 0x5d1;
    }
LAB_00112c89:
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
               ,iVar15,pcVar24,iVar13);
  }
LAB_0011271f:
  pcVar24 = "ssl_encrypt_buf";
  iVar15 = 0xb08;
LAB_0011273d:
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_tls.c"
             ,iVar15,pcVar24,iVar13);
  return iVar13;
}

Assistant:

int mbedtls_ssl_write_record( mbedtls_ssl_context *ssl )
{
    int ret, done = 0, out_msg_type;
    size_t len = ssl->out_msglen;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> write record" ) );

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state == MBEDTLS_SSL_RETRANS_SENDING )
    {
        ; /* Skip special handshake treatment when resending */
    }
    else
#endif
    if( ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE )
    {
        out_msg_type = ssl->out_msg[0];

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST &&
            ssl->handshake == NULL )
        {
            MBEDTLS_SSL_DEBUG_MSG( 1, ( "should never happen" ) );
            return( MBEDTLS_ERR_SSL_INTERNAL_ERROR );
        }

        ssl->out_msg[1] = (unsigned char)( ( len - 4 ) >> 16 );
        ssl->out_msg[2] = (unsigned char)( ( len - 4 ) >>  8 );
        ssl->out_msg[3] = (unsigned char)( ( len - 4 )       );

        /*
         * DTLS has additional fields in the Handshake layer,
         * between the length field and the actual payload:
         *      uint16 message_seq;
         *      uint24 fragment_offset;
         *      uint24 fragment_length;
         */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
        if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM )
        {
            /* Make room for the additional DTLS fields */
            memmove( ssl->out_msg + 12, ssl->out_msg + 4, len - 4 );
            ssl->out_msglen += 8;
            len += 8;

            /* Write message_seq and update it, except for HelloRequest */
            if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            {
                ssl->out_msg[4] = ( ssl->handshake->out_msg_seq >> 8 ) & 0xFF;
                ssl->out_msg[5] = ( ssl->handshake->out_msg_seq      ) & 0xFF;
                ++( ssl->handshake->out_msg_seq );
            }
            else
            {
                ssl->out_msg[4] = 0;
                ssl->out_msg[5] = 0;
            }

            /* We don't fragment, so frag_offset = 0 and frag_len = len */
            memset( ssl->out_msg + 6, 0x00, 3 );
            memcpy( ssl->out_msg + 9, ssl->out_msg + 1, 3 );
        }
#endif /* MBEDTLS_SSL_PROTO_DTLS */

        if( out_msg_type != MBEDTLS_SSL_HS_HELLO_REQUEST )
            ssl->handshake->update_checksum( ssl, ssl->out_msg, len );
    }

    /* Save handshake and CCS messages for resending */
#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if( ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        ssl->handshake != NULL &&
        ssl->handshake->retransmit_state != MBEDTLS_SSL_RETRANS_SENDING &&
        ( ssl->out_msgtype == MBEDTLS_SSL_MSG_CHANGE_CIPHER_SPEC ||
          ssl->out_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE ) )
    {
        if( ( ret = ssl_flight_append( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_flight_append", ret );
            return( ret );
        }
    }
#endif

#if defined(MBEDTLS_ZLIB_SUPPORT)
    if( ssl->transform_out != NULL &&
        ssl->session_out->compression == MBEDTLS_SSL_COMPRESS_DEFLATE )
    {
        if( ( ret = ssl_compress_buf( ssl ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "ssl_compress_buf", ret );
            return( ret );
        }

        len = ssl->out_msglen;
    }
#endif /*MBEDTLS_ZLIB_SUPPORT */

#if defined(MBEDTLS_SSL_HW_RECORD_ACCEL)
    if( mbedtls_ssl_hw_record_write != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 2, ( "going for mbedtls_ssl_hw_record_write()" ) );

        ret = mbedtls_ssl_hw_record_write( ssl );
        if( ret != 0 && ret != MBEDTLS_ERR_SSL_HW_ACCEL_FALLTHROUGH )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_hw_record_write", ret );
            return( MBEDTLS_ERR_SSL_HW_ACCEL_FAILED );
        }

        if( ret == 0 )
            done = 1;
    }
#endif /* MBEDTLS_SSL_HW_RECORD_ACCEL */
    if( !done )
    {
        ssl->out_hdr[0] = (unsigned char) ssl->out_msgtype;
        mbedtls_ssl_write_version( ssl->major_ver, ssl->minor_ver,
                           ssl->conf->transport, ssl->out_hdr + 1 );

        ssl->out_len[0] = (unsigned char)( len >> 8 );
        ssl->out_len[1] = (unsigned char)( len      );

        if( ssl->transform_out != NULL )
        {
            if( ( ret = ssl_encrypt_buf( ssl ) ) != 0 )
            {
                MBEDTLS_SSL_DEBUG_RET( 1, "ssl_encrypt_buf", ret );
                return( ret );
            }

            len = ssl->out_msglen;
            ssl->out_len[0] = (unsigned char)( len >> 8 );
            ssl->out_len[1] = (unsigned char)( len      );
        }

        ssl->out_left = mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen;

        MBEDTLS_SSL_DEBUG_MSG( 3, ( "output record: msgtype = %d, "
                            "version = [%d:%d], msglen = %d",
                       ssl->out_hdr[0], ssl->out_hdr[1], ssl->out_hdr[2],
                     ( ssl->out_len[0] << 8 ) | ssl->out_len[1] ) );

        MBEDTLS_SSL_DEBUG_BUF( 4, "output record sent to network",
                       ssl->out_hdr, mbedtls_ssl_hdr_len( ssl ) + ssl->out_msglen );
    }

    if( ( ret = mbedtls_ssl_flush_output( ssl ) ) != 0 )
    {
        MBEDTLS_SSL_DEBUG_RET( 1, "mbedtls_ssl_flush_output", ret );
        return( ret );
    }

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= write record" ) );

    return( 0 );
}